

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusxmlparser.cpp
# Opt level: O0

bool __thiscall QDBusXmlParser::parseSignal(QDBusXmlParser *this,Signal *signalData)

{
  QLatin1StringView str;
  QLatin1StringView s;
  QLatin1StringView s_00;
  QLatin1StringView str_00;
  QLatin1StringView str_01;
  QStringView memberName;
  QAnyStringView qualifiedName;
  bool bVar1;
  char *pcVar2;
  pointer pIVar3;
  char *pcVar4;
  QXmlStreamAttributes *in_RSI;
  QDBusXmlParser *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar5;
  undefined1 auVar6 [16];
  Argument argument;
  QXmlStreamAttributes attributes_1;
  Annotations annotations;
  Arguments arguments;
  QString signalName;
  QXmlStreamAttributes attributes;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined7 in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc4f;
  Argument *in_stack_fffffffffffffc50;
  QAnyStringView *in_stack_fffffffffffffc58;
  undefined7 in_stack_fffffffffffffc60;
  undefined1 in_stack_fffffffffffffc67;
  QString *in_stack_fffffffffffffc68;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_fffffffffffffc70;
  DiagnosticsReporter *pDVar7;
  QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_char16_t>
  *in_stack_fffffffffffffc78;
  SourceLocation *pSVar8;
  QString *in_stack_fffffffffffffc80;
  QLatin1StringView in_stack_fffffffffffffca0;
  QLatin1StringView in_stack_fffffffffffffcb0;
  QDBusXmlParser *this_00;
  bool local_2f1;
  QString local_2e0 [2];
  char local_2b0 [32];
  undefined1 local_290 [16];
  QString local_280 [2];
  QLatin1StringView local_250;
  undefined1 local_230 [16];
  qint64 local_210;
  qint64 local_208;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  QLatin1StringView local_1b8;
  undefined1 local_1a8 [16];
  QLatin1StringView local_198;
  undefined1 local_188 [16];
  undefined1 *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  undefined2 local_152;
  QLatin1StringView local_150;
  char local_f8 [112];
  undefined1 local_88 [16];
  QString local_78;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QXmlStreamReader::attributes();
  local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QVar5 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffffc58,(size_t)in_stack_fffffffffffffc50);
  str.m_size._7_1_ = in_stack_fffffffffffffc67;
  str.m_size._0_7_ = in_stack_fffffffffffffc60;
  str.m_data = (char *)in_stack_fffffffffffffc68;
  QAnyStringView::QAnyStringView(in_stack_fffffffffffffc58,str);
  local_88 = QXmlStreamAttributes::value((QAnyStringView *)&local_60);
  QStringView::toString((QStringView *)in_stack_fffffffffffffc50);
  QStringView::QStringView<QString,_true>
            ((QStringView *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
             (QString *)in_stack_fffffffffffffc58);
  memberName.m_data = (storage_type_conflict *)in_stack_fffffffffffffc78;
  memberName.m_size = (qsizetype)in_stack_fffffffffffffc70.m_data;
  bVar1 = QDBusUtil::isValidMemberName(memberName);
  if (bVar1) {
    QString::operator=((QString *)(in_RSI + 0x10),&local_78);
    local_150 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffc58,(size_t)in_stack_fffffffffffffc50);
    ::operator+((QLatin1String *)in_stack_fffffffffffffc50,
                (QString *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
    local_152 = 0x22;
    ::operator+((QStringBuilder<QLatin1String,_const_QString_&> *)in_stack_fffffffffffffc50,
                (char16_t *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
    std::
    unique_ptr<QDBusIntrospection::Interface,_std::default_delete<QDBusIntrospection::Interface>_>::
    operator->((unique_ptr<QDBusIntrospection::Interface,_std::default_delete<QDBusIntrospection::Interface>_>
                *)0x2423da);
    ::operator+=(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    local_170 = &DAT_aaaaaaaaaaaaaaaa;
    local_168 = &DAT_aaaaaaaaaaaaaaaa;
    local_160 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QDBusIntrospection::Argument>::QList((QList<QDBusIntrospection::Argument> *)0x242428);
    local_178 = &DAT_aaaaaaaaaaaaaaaa;
    QMap<QString,_QDBusIntrospection::Annotation>::QMap
              ((QMap<QString,_QDBusIntrospection::Annotation> *)0x242444);
    bVar1 = readNextStartElement
                      ((QDBusXmlParser *)
                       CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
    if (bVar1) {
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffc58,(size_t)in_stack_fffffffffffffc50);
      std::
      unique_ptr<QDBusIntrospection::Interface,_std::default_delete<QDBusIntrospection::Interface>_>
      ::operator->((unique_ptr<QDBusIntrospection::Interface,_std::default_delete<QDBusIntrospection::Interface>_>
                    *)0x2424ce);
      s_00.m_size._7_1_ = in_stack_fffffffffffffc67;
      s_00.m_size._0_7_ = in_stack_fffffffffffffc60;
      s_00.m_data = (char *)in_stack_fffffffffffffc68;
      QString::operator+=((QString *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                          s_00);
      do {
        auVar6 = QXmlStreamReader::name();
        local_188 = auVar6;
        local_198 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)in_stack_fffffffffffffc58,(size_t)in_stack_fffffffffffffc50);
        bVar1 = ::operator==((QStringView *)in_stack_fffffffffffffc50,
                             (QLatin1StringView *)
                             CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
        if (bVar1) {
          parseAnnotation((QDBusXmlParser *)in_stack_fffffffffffffcb0.m_size,
                          (Annotations *)in_stack_fffffffffffffca0.m_data,
                          in_stack_fffffffffffffca0.m_size._7_1_);
        }
        else {
          auVar6 = QXmlStreamReader::name();
          local_1a8 = auVar6;
          local_1b8 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)in_stack_fffffffffffffc58,(size_t)in_stack_fffffffffffffc50
                                );
          bVar1 = ::operator==((QStringView *)in_stack_fffffffffffffc50,
                               (QLatin1StringView *)
                               CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
          if (bVar1) {
            local_1d0 = &DAT_aaaaaaaaaaaaaaaa;
            local_1c8 = &DAT_aaaaaaaaaaaaaaaa;
            local_1c0 = &DAT_aaaaaaaaaaaaaaaa;
            QXmlStreamReader::attributes();
            memset(&local_210,0xaa,0x40);
            QDBusIntrospection::Argument::Argument(in_stack_fffffffffffffc50);
            local_210 = (in_RDI->m_currentLocation).lineNumber;
            local_208 = (in_RDI->m_currentLocation).columnNumber;
            in_stack_fffffffffffffcb0 =
                 Qt::Literals::StringLiterals::operator____L1
                           ((char *)in_stack_fffffffffffffc58,(size_t)in_stack_fffffffffffffc50);
            str_00.m_size._7_1_ = in_stack_fffffffffffffc67;
            str_00.m_size._0_7_ = in_stack_fffffffffffffc60;
            str_00.m_data = (char *)in_stack_fffffffffffffc68;
            QAnyStringView::QAnyStringView(in_stack_fffffffffffffc58,str_00);
            qualifiedName.m_size = (size_t)in_stack_fffffffffffffc78;
            qualifiedName.field_0.m_data = in_stack_fffffffffffffc70.m_data;
            bVar1 = QXmlStreamAttributes::hasAttribute
                              ((QXmlStreamAttributes *)
                               CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                               qualifiedName);
            in_stack_fffffffffffffc67 = true;
            if (bVar1) {
              in_stack_fffffffffffffca0 =
                   Qt::Literals::StringLiterals::operator____L1
                             ((char *)in_stack_fffffffffffffc58,(size_t)in_stack_fffffffffffffc50);
              str_01.m_size._7_1_ = in_stack_fffffffffffffc67;
              str_01.m_size._0_7_ = in_stack_fffffffffffffc60;
              str_01.m_data = (char *)in_stack_fffffffffffffc68;
              QAnyStringView::QAnyStringView(in_stack_fffffffffffffc58,str_01);
              auVar6 = QXmlStreamAttributes::value((QAnyStringView *)&local_1d0);
              local_230 = auVar6;
              local_250 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)in_stack_fffffffffffffc58,
                                     (size_t)in_stack_fffffffffffffc50);
              in_stack_fffffffffffffc67 =
                   ::operator==((QStringView *)in_stack_fffffffffffffc50,
                                (QLatin1StringView *)
                                CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
            }
            if ((bool)in_stack_fffffffffffffc67 != false) {
              parseArg(this_00,in_RSI,(Argument *)QVar5.m_data);
              QList<QDBusIntrospection::Argument>::operator<<
                        ((QList<QDBusIntrospection::Argument> *)in_stack_fffffffffffffc50,
                         (parameter_type)
                         CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
            }
            QDBusIntrospection::Argument::~Argument(in_stack_fffffffffffffc50);
            QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x242788);
          }
          else if (in_RDI->m_reporter == (DiagnosticsReporter *)0x0) {
            local_48 = &DAT_aaaaaaaaaaaaaaaa;
            local_40 = &DAT_aaaaaaaaaaaaaaaa;
            QtPrivateLogging::dbusParser();
            anon_unknown.dwarf_41d3d1::QLoggingCategoryMacroHolder<(QtMsgType)0>::
            QLoggingCategoryMacroHolder
                      ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffc50,
                       (QLoggingCategory *)
                       CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
            while( true ) {
              bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                ((QLoggingCategoryMacroHolder *)&local_48);
              if (!bVar1) break;
              anon_unknown.dwarf_41d3d1::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                        ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x2428a3);
              QMessageLogger::QMessageLogger
                        ((QMessageLogger *)
                         CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
                         (char *)in_stack_fffffffffffffc58,
                         (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                         (char *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                         (char *)0x2428bc);
              QXmlStreamReader::name();
              QStringView::toString((QStringView *)in_stack_fffffffffffffc50);
              QtPrivate::asString(local_2e0);
              QString::toLocal8Bit(in_stack_fffffffffffffc68);
              pcVar2 = QByteArray::constData((QByteArray *)0x242919);
              QMessageLogger::debug
                        (local_2b0,
                         "Warning: Unknown element \'%s\' while checking for signal arguments",
                         pcVar2);
              QByteArray::~QByteArray((QByteArray *)0x24293f);
              QString::~QString((QString *)0x24294c);
              local_40 = (undefined1 *)((ulong)local_40 & 0xffffffffffffff00);
            }
          }
          else {
            in_stack_fffffffffffffc50 = (Argument *)in_RDI->m_reporter;
            in_stack_fffffffffffffc58 = (QAnyStringView *)&in_RDI->m_currentLocation;
            auVar6 = QXmlStreamReader::name();
            local_290 = auVar6;
            QStringView::toString((QStringView *)in_stack_fffffffffffffc50);
            QtPrivate::asString(local_280);
            QString::toLocal8Bit(in_stack_fffffffffffffc68);
            pcVar2 = QByteArray::constData((QByteArray *)0x242811);
            (**(code **)((in_stack_fffffffffffffc50->location).lineNumber + 0x10))
                      (in_stack_fffffffffffffc50,in_stack_fffffffffffffc58,
                       "Unknown element \'%s\' while checking for signal arguments\n",pcVar2);
            QByteArray::~QByteArray((QByteArray *)0x24283b);
            QString::~QString((QString *)0x242848);
          }
        }
        QXmlStreamReader::skipCurrentElement();
        bVar1 = readNextStartElement
                          ((QDBusXmlParser *)
                           CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
      } while (bVar1);
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffc58,(size_t)in_stack_fffffffffffffc50);
      std::
      unique_ptr<QDBusIntrospection::Interface,_std::default_delete<QDBusIntrospection::Interface>_>
      ::operator->((unique_ptr<QDBusIntrospection::Interface,_std::default_delete<QDBusIntrospection::Interface>_>
                    *)0x2429ac);
      QVar5.m_size._7_1_ = in_stack_fffffffffffffc67;
      QVar5.m_size._0_7_ = in_stack_fffffffffffffc60;
      QVar5.m_data = (char *)in_stack_fffffffffffffc68;
      QString::operator+=((QString *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                          QVar5);
    }
    else {
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffc58,(size_t)in_stack_fffffffffffffc50);
      std::
      unique_ptr<QDBusIntrospection::Interface,_std::default_delete<QDBusIntrospection::Interface>_>
      ::operator->((unique_ptr<QDBusIntrospection::Interface,_std::default_delete<QDBusIntrospection::Interface>_>
                    *)0x242481);
      s.m_size._7_1_ = in_stack_fffffffffffffc67;
      s.m_size._0_7_ = in_stack_fffffffffffffc60;
      s.m_data = (char *)in_stack_fffffffffffffc68;
      QString::operator+=((QString *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),s
                         );
    }
    QList<QDBusIntrospection::Argument>::operator=
              ((QList<QDBusIntrospection::Argument> *)in_stack_fffffffffffffc50,
               (QList<QDBusIntrospection::Argument> *)
               CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
    QMap<QString,_QDBusIntrospection::Annotation>::operator=
              ((QMap<QString,_QDBusIntrospection::Annotation> *)in_stack_fffffffffffffc50,
               (QMap<QString,_QDBusIntrospection::Annotation> *)
               CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
    local_2f1 = true;
    QMap<QString,_QDBusIntrospection::Annotation>::~QMap
              ((QMap<QString,_QDBusIntrospection::Annotation> *)0x242a14);
    QList<QDBusIntrospection::Argument>::~QList((QList<QDBusIntrospection::Argument> *)0x242a21);
  }
  else {
    if (in_RDI->m_reporter == (DiagnosticsReporter *)0x0) {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QtPrivateLogging::dbusParser();
      anon_unknown.dwarf_41d3d1::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffc50,
                 (QLoggingCategory *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
      while( true ) {
        bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                          ((QLoggingCategoryMacroHolder *)&local_18);
        if (!bVar1) break;
        anon_unknown.dwarf_41d3d1::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x24226c);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
                   (char *)in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20)
                   ,(char *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                   (char *)0x242285);
        QtPrivate::asString(&local_78);
        QString::toLocal8Bit(in_stack_fffffffffffffc68);
        in_stack_fffffffffffffc68 = (QString *)QByteArray::constData((QByteArray *)0x2422af);
        pIVar3 = std::
                 unique_ptr<QDBusIntrospection::Interface,_std::default_delete<QDBusIntrospection::Interface>_>
                 ::operator->((unique_ptr<QDBusIntrospection::Interface,_std::default_delete<QDBusIntrospection::Interface>_>
                               *)0x2422c2);
        QtPrivate::asString(&pIVar3->name);
        QString::toLocal8Bit(in_stack_fffffffffffffc68);
        pcVar2 = QByteArray::constData((QByteArray *)0x2422eb);
        QMessageLogger::debug
                  (local_f8,
                   "Error: Invalid D-Bus member name \'%s\' found in interface \'%s\' while parsing introspection"
                   ,in_stack_fffffffffffffc68,pcVar2);
        QByteArray::~QByteArray((QByteArray *)0x242316);
        QByteArray::~QByteArray((QByteArray *)0x242323);
        local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
      }
    }
    else {
      pDVar7 = in_RDI->m_reporter;
      pSVar8 = &in_RDI->m_currentLocation;
      QtPrivate::asString(&local_78);
      QString::toLocal8Bit(in_stack_fffffffffffffc68);
      pcVar2 = QByteArray::constData((QByteArray *)0x242199);
      pIVar3 = std::
               unique_ptr<QDBusIntrospection::Interface,_std::default_delete<QDBusIntrospection::Interface>_>
               ::operator->((unique_ptr<QDBusIntrospection::Interface,_std::default_delete<QDBusIntrospection::Interface>_>
                             *)0x2421ac);
      QtPrivate::asString(&pIVar3->name);
      QString::toLocal8Bit(in_stack_fffffffffffffc68);
      pcVar4 = QByteArray::constData((QByteArray *)0x2421d5);
      (*pDVar7->_vptr_DiagnosticsReporter[3])
                (pDVar7,pSVar8,
                 "Invalid D-Bus member name \'%s\' found in interface \'%s\' while parsing introspection\n"
                 ,pcVar2,pcVar4);
      QByteArray::~QByteArray((QByteArray *)0x242204);
      QByteArray::~QByteArray((QByteArray *)0x242211);
    }
    local_2f1 = false;
  }
  QString::~QString((QString *)0x242a2e);
  QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x242a3b);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_2f1;
}

Assistant:

bool QDBusXmlParser::parseSignal(QDBusIntrospection::Signal &signalData)
{
    Q_ASSERT(m_currentInterface);
    Q_ASSERT(m_xml.isStartElement() && m_xml.name() == "signal"_L1);

    const QXmlStreamAttributes attributes = m_xml.attributes();
    const QString signalName = attributes.value("name"_L1).toString();

    if (!QDBusUtil::isValidMemberName(signalName)) {
        qDBusParserError("Invalid D-Bus member name '%s' found in interface '%s' while parsing "
                         "introspection",
                         qPrintable(signalName), qPrintable(m_currentInterface->name));
        return false;
    }

    signalData.name = signalName;
    m_currentInterface->introspection += "    <signal name=\""_L1 + signalName + u'"';

    QDBusIntrospection::Arguments arguments;
    QDBusIntrospection::Annotations annotations;

    if (!readNextStartElement()) {
        m_currentInterface->introspection += "/>\n"_L1;
    } else {
        m_currentInterface->introspection += ">\n"_L1;

        do {
            if (m_xml.name() == "annotation"_L1) {
                parseAnnotation(annotations);
            } else if (m_xml.name() == "arg"_L1) {
                const QXmlStreamAttributes attributes = m_xml.attributes();
                QDBusIntrospection::Argument argument;
                argument.location = m_currentLocation;
                if (!attributes.hasAttribute("direction"_L1) ||
                    attributes.value("direction"_L1) == "out"_L1) {
                    parseArg(attributes, argument);
                    arguments << argument;
                }
            } else {
                qDBusParserWarning("Unknown element '%s' while checking for signal arguments",
                                   qPrintable(m_xml.name().toString()));
            }
            m_xml.skipCurrentElement();
        } while (readNextStartElement());

        m_currentInterface->introspection += "    </signal>\n"_L1;
    }

    signalData.outputArgs = arguments;
    signalData.annotations = annotations;

    return true;
}